

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

bool __thiscall Remapper::remap_srv(Remapper *this,D3DBinding *binding,VulkanSRVBinding *vk_binding)

{
  dxil_spv_bool dVar1;
  undefined8 local_8c;
  undefined8 local_84;
  undefined8 local_7c;
  undefined1 local_74 [8];
  dxil_spv_srv_vulkan_binding c_vk_binding;
  dxil_spv_d3d_binding c_binding;
  VulkanSRVBinding *vk_binding_local;
  D3DBinding *binding_local;
  Remapper *this_local;
  
  if (this->srv_remapper == (dxil_spv_srv_remapper_cb)0x0) {
    (vk_binding->buffer_binding).bindless.use_heap = false;
    (vk_binding->buffer_binding).descriptor_set = binding->register_space;
    (vk_binding->buffer_binding).binding = binding->register_index;
    (vk_binding->buffer_binding).descriptor_type = Identity;
    memset(&local_8c,0,0x18);
    (vk_binding->offset_binding).descriptor_set = (undefined4)local_8c;
    (vk_binding->offset_binding).binding = local_8c._4_4_;
    (vk_binding->offset_binding).root_constant_index = (undefined4)local_84;
    (vk_binding->offset_binding).bindless.heap_root_offset = local_84._4_4_;
    *(undefined8 *)&(vk_binding->offset_binding).bindless.use_heap = local_7c;
    this_local._7_1_ = true;
  }
  else {
    c_vk_binding.offset_binding.bindless._4_4_ = binding->stage;
    c_vk_binding.offset_binding.descriptor_type = (dxil_spv_vulkan_descriptor_type)binding->kind;
    memset(local_74,0,0x30);
    dVar1 = (*this->srv_remapper)
                      (this->srv_userdata,
                       (dxil_spv_d3d_binding *)&c_vk_binding.offset_binding.bindless.use_heap,
                       (dxil_spv_srv_vulkan_binding *)local_74);
    if (dVar1 == '\x01') {
      copy_buffer_binding(&vk_binding->buffer_binding,(dxil_spv_vulkan_binding *)local_74);
      copy_buffer_binding(&vk_binding->offset_binding,
                          (dxil_spv_vulkan_binding *)&c_vk_binding.buffer_binding.bindless.use_heap)
      ;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool remap_srv(const D3DBinding &binding, VulkanSRVBinding &vk_binding) override
	{
		if (srv_remapper)
		{
			const dxil_spv_d3d_binding c_binding = { static_cast<dxil_spv_shader_stage>(binding.stage),
				                                     static_cast<dxil_spv_resource_kind>(binding.kind),
				                                     binding.resource_index,
				                                     binding.register_space,
				                                     binding.register_index,
				                                     binding.range_size,
				                                     binding.alignment };

			dxil_spv_srv_vulkan_binding c_vk_binding = {};
			if (srv_remapper(srv_userdata, &c_binding, &c_vk_binding) == DXIL_SPV_TRUE)
			{
				copy_buffer_binding(vk_binding.buffer_binding, c_vk_binding.buffer_binding);
				copy_buffer_binding(vk_binding.offset_binding, c_vk_binding.offset_binding);
				return true;
			}
			else
				return false;
		}
		else
		{
			vk_binding.buffer_binding.bindless.use_heap = false;
			vk_binding.buffer_binding.descriptor_set = binding.register_space;
			vk_binding.buffer_binding.binding = binding.register_index;
			vk_binding.buffer_binding.descriptor_type = VulkanDescriptorType::Identity;
			vk_binding.offset_binding = {};
			return true;
		}
	}